

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

FILE * open_config_file(fnchar *filename)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  FILE *local_20;
  FILE *fp;
  fnchar *filename_local;
  
  local_20 = fopen(filename,"w");
  if (local_20 == (FILE *)0x0) {
    piVar1 = __errno_location();
    if (*piVar1 != 0x14) {
      piVar1 = __errno_location();
      if (*piVar1 != 2) goto LAB_0011594f;
    }
    local_20 = fopen(filename,"w");
  }
LAB_0011594f:
  __stream = _stderr;
  if (local_20 == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"could not open %s: %s",filename,pcVar2);
    filename_local = (fnchar *)0x0;
  }
  else {
    chmod(filename,0x1a4);
    fprintf(local_20,"# note: this file is rewritten whenever options are changed ingame\n");
    filename_local = (fnchar *)local_20;
  }
  return (FILE *)filename_local;
}

Assistant:

static FILE *open_config_file(fnchar *filename)
{
    FILE *fp;

    fp = fopen(filename, "w");
    if (!fp && (errno == ENOTDIR || errno == ENOENT)) {
	fp = fopen(filename, "w");
    }

    if (!fp) {
	fprintf(stderr, "could not open " FN_FMT ": %s", filename, strerror(errno));
	return NULL;
    }

#ifdef UNIX
    chmod(filename, 0644);
#endif

    fprintf(fp, "# note: this file is rewritten whenever options are changed ingame\n");

    return fp;
}